

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolledPipelineDesc.cpp
# Opt level: O3

int __thiscall
PolledPipelineDesc::poll(PolledPipelineDesc *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  uint *puVar1;
  pointer puVar2;
  int iVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  Pipeline *__p;
  undefined4 in_register_0000000c;
  char *pcVar5;
  undefined8 unaff_RBP;
  string_view s;
  Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  anon_union_120_2_9b3c4038_for_Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_a8;
  char local_30;
  
  pcVar5 = (char *)CONCAT44(in_register_0000000c,__timeout);
  if ((this->super_PolledResource).poll_seq_ != (uint)__fds) {
    (this->super_PolledResource).poll_seq_ = (uint)__fds;
    iVar3 = PolledFile::poll((this->file_).
                             super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fds
                             ,__nfds,__timeout);
    if ((char)iVar3 != '\0') {
      pvVar4 = PolledFile::data((this->file_).
                                super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar4 = PolledFile::data((this->file_).
                                super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      s._M_str = pcVar5;
      s._M_len = (size_t)puVar2;
      renderdesc::Pipeline::load_abi_cxx11_
                ((Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8.value_,
                 (Pipeline *)
                 ((pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish +
                 -(long)(pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start),s);
      if (local_30 == '\0') {
        aAppDebugPrintf("Error parsing pipeline desc: %s",
                        local_a8.value_.textures.
                        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        __p = (Pipeline *)operator_new(0x78);
        (__p->textures).
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_a8.value_.textures.
             super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__p->textures).
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.value_.textures.
             super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (__p->textures).
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_a8.value_.textures.
             super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_a8.value_.textures.
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8.value_.textures.
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.value_.textures.
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__p->framebuffers).
        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_a8.value_.framebuffers.
             super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (__p->framebuffers).
        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_a8.value_.framebuffers.
             super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (__p->framebuffers).
        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_a8.value_.framebuffers.
             super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8.value_.framebuffers.
        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8.value_.framebuffers.
        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.value_.framebuffers.
        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__p->shader_filenames).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_a8.value_.shader_filenames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__p->shader_filenames).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_a8.value_.shader_filenames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__p->shader_filenames).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_a8.value_.shader_filenames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8.value_.shader_filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8.value_.shader_filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.value_.shader_filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__p->programs).
        super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_a8.value_.programs.
             super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__p->programs).
        super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.value_.programs.
             super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (__p->programs).
        super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_a8.value_.programs.
             super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_a8.value_.programs.
        super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8.value_.programs.
        super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.value_.programs.
        super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__p->commands).
        super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_a8.value_.commands.
             super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__p->commands).
        super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.value_.commands.
             super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (__p->commands).
        super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_a8.value_.commands.
             super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_a8.value_.commands.
        super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8.value_.commands.
        super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.value_.commands.
        super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::__shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>::
        reset<renderdesc::Pipeline>
                  (&(this->pipeline_).
                    super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>,__p);
        puVar1 = &(this->super_PolledResource).resource_version_;
        *puVar1 = *puVar1 + 1;
      }
      Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8.value_);
      return (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),local_30);
    }
  }
  return 0;
}

Assistant:

PolledPipelineDesc::~PolledPipelineDesc()
{
}